

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Displacement.cpp
# Opt level: O1

int __thiscall
OpenMD::DisplacementZ::computeProperty1(DisplacementZ *this,int frame,StuntDouble *sd)

{
  vector<int,std::allocator<int>> *this_00;
  DataStoragePointer DVar1;
  Snapshot *pSVar2;
  pointer pvVar3;
  iterator __position;
  int iVar4;
  long lVar5;
  undefined1 *puVar6;
  uint i_1;
  Vector3d *pVVar7;
  long lVar8;
  int zBin;
  Vector3d pos;
  Vector3<double> local_48;
  Vector3d local_28;
  
  DVar1 = sd->storage_;
  pSVar2 = sd->snapshotMan_->currentSnapshot_;
  lVar5 = (long)sd->localIndex_ * 0x18;
  pVVar7 = (Vector3d *)
           (*(long *)((long)&(pSVar2->atomData).position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + DVar1) + lVar5);
  local_28.super_Vector<double,_3U>.data_[0] = 0.0;
  local_28.super_Vector<double,_3U>.data_[1] = 0.0;
  local_28.super_Vector<double,_3U>.data_[2] = 0.0;
  if (pVVar7 != &local_28) {
    lVar8 = 0;
    do {
      local_28.super_Vector<double,_3U>.data_[lVar8] =
           (pVVar7->super_Vector<double,_3U>).data_[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
  }
  pvVar3 = (this->positions_).
           super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar6 = (undefined1 *)
           (lVar5 + *(long *)((long)&(pSVar2->atomData).position.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + DVar1));
  local_48.super_Vector<double,_3U>.data_[0] = 0.0;
  local_48.super_Vector<double,_3U>.data_[1] = 0.0;
  local_48.super_Vector<double,_3U>.data_[2] = 0.0;
  if ((Vector3<double> *)puVar6 != &local_48) {
    lVar5 = 0;
    do {
      local_48.super_Vector<double,_3U>.data_[lVar5] = *(double *)(puVar6 + lVar5 * 8);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
  }
  std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
  emplace_back<OpenMD::Vector3<double>>
            ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)
             (pvVar3 + frame),&local_48);
  if ((((this->super_ObjectACF<OpenMD::Vector3<double>_>).
        super_AutoCorrFunc<OpenMD::Vector3<double>_>.super_TimeCorrFunc<OpenMD::Vector3<double>_>.
       info_)->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b == '\x01')
  {
    Snapshot::wrapVector
              ((this->super_ObjectACF<OpenMD::Vector3<double>_>).
               super_AutoCorrFunc<OpenMD::Vector3<double>_>.
               super_TimeCorrFunc<OpenMD::Vector3<double>_>.currentSnapshot_,&local_28);
  }
  iVar4 = (int)(((this->halfBoxZ_ + local_28.super_Vector<double,_3U>.data_[(uint)this->axis_]) *
                (double)this->nZBins_) /
               *(double *)
                ((long)(this->hmat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                       data_ + (ulong)(uint)this->axis_ * 0x20));
  local_48.super_Vector<double,_3U>.data_[0] =
       (double)CONCAT44(local_48.super_Vector<double,_3U>.data_[0]._4_4_,iVar4);
  this_00 = (vector<int,std::allocator<int>> *)
            ((this->zBins_).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + frame);
  __position._M_current = *(int **)(this_00 + 8);
  if (__position._M_current == *(int **)(this_00 + 0x10)) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              (this_00,__position,(int *)&local_48);
  }
  else {
    *__position._M_current = iVar4;
    *(int **)(this_00 + 8) = __position._M_current + 1;
  }
  pvVar3 = (this->positions_).
           super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  return (int)((ulong)((long)*(pointer *)
                              ((long)&pvVar3[frame].
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data + 8) -
                      *(long *)&pvVar3[frame].
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data) >> 3) * -0x55555555 + -1;
}

Assistant:

int DisplacementZ::computeProperty1(int frame, StuntDouble* sd) {
    Vector3d pos = sd->getPos();
    // we need the raw (not wrapped) positions for RMSD:
    positions_[frame].push_back(sd->getPos());

    if (info_->getSimParams()->getUsePeriodicBoundaryConditions()) {
      currentSnapshot_->wrapVector(pos);
    }
    int zBin = int(nZBins_ * (halfBoxZ_ + pos[axis_]) / hmat_(axis_, axis_));
    zBins_[frame].push_back(zBin);

    return positions_[frame].size() - 1;
  }